

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O1

int __thiscall WellFounded::getId(WellFounded *this,Lit l)

{
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> pVar1;
  Lit local_1c;
  pair<int,_int> local_18;
  
  local_18.second = (this->lits).sz;
  local_1c.x = l.x;
  local_18.first = l.x;
  pVar1 = std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::_M_emplace_unique<std::pair<int,int>>
                    ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                      *)&this->lit_to_index,&local_18);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    vec<Lit>::push(&this->lits,&local_1c);
  }
  return *(int *)&pVar1.first._M_node._M_node[1].field_0x4;
}

Assistant:

int getId(Lit l) {
		const std::pair<std::map<int, int>::iterator, bool> p =
				lit_to_index.insert(std::pair<int, int>(toInt(l), lits.size()));
		if (p.second) {
			lits.push(l);
		}
		return p.first->second;
	}